

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpproxy.cpp
# Opt level: O0

void __thiscall tcpproxy::~tcpproxy(tcpproxy *this)

{
  naiveconfig *pnVar1;
  naiveconfig *this_00;
  tcpproxy *this_local;
  
  (this->super_proxy)._vptr_proxy = (_func_int **)&PTR__tcpproxy_00118d70;
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear(&this->sfh);
  if (this->events != (epoll_event *)0x0) {
    if (this->events != (epoll_event *)0x0) {
      operator_delete__(this->events);
    }
    this->events = (epoll_event *)0x0;
  }
  if ((this->super_proxy).cfg != (naiveconfig *)0x0) {
    pnVar1 = (this->super_proxy).cfg;
    if (pnVar1 != (naiveconfig *)0x0) {
      this_00 = pnVar1 + *(long *)&pnVar1[-1].field_0x30;
      while (pnVar1 != this_00) {
        this_00 = this_00 + -1;
        naiveconfig::~naiveconfig(this_00);
      }
      operator_delete__(&pnVar1[-1].field_0x30);
    }
    (this->super_proxy).cfg = (naiveconfig *)0x0;
  }
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~unordered_map(&this->sfh);
  proxy::~proxy(&this->super_proxy);
  return;
}

Assistant:

tcpproxy::~tcpproxy()
{
    sfh.clear();
    if (events)
    {
        delete[] events;
        events = NULL;
    }
    if (cfg)
    {
        delete[] cfg;
        cfg = NULL;
    }
}